

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_builder_twolevel.h
# Opt level: O2

void __thiscall
embree::avx::BVHNBuilderTwoLevel<4,_embree::QuadMesh,_embree::QuadMv<4>_>::createMeshAccel
          (BVHNBuilderTwoLevel<4,_embree::QuadMesh,_embree::QuadMv<4>_> *this,size_t geomID,
          Builder **builder)

{
  QuadMesh *mesh;
  BVHN<4> *this_00;
  undefined8 *puVar1;
  allocator local_49;
  MeshBuilder<4,_embree::QuadMesh,_embree::QuadMv<4>_> local_48 [32];
  
  this_00 = (BVHN<4> *)BVHN<4>::operator_new(0x240);
  BVHN<4>::BVHN(this_00,(PrimitiveType *)&QuadMv<4>::type,*(Scene **)(this + 0x30));
  *(BVHN<4> **)(*(long *)(*(long *)(this + 0x28) + 0x200) + geomID * 8) = this_00;
  mesh = *(QuadMesh **)(*(long *)(*(long *)(this + 0x30) + 0x1e8) + geomID * 8);
  if ((mesh != (QuadMesh *)0x0) && (*(char *)&(mesh->super_Geometry).field_8 == '\x15')) {
    __internal_two_level_builder__::MeshBuilder<4,_embree::QuadMesh,_embree::QuadMv<4>_>::operator()
              (local_48,*(void **)(*(long *)(*(long *)(this + 0x28) + 0x200) + geomID * 8),mesh,
               geomID,*(GTypeMask *)(this + 0x98),(bool)this[0xa0],builder);
    return;
  }
  puVar1 = (undefined8 *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string((string *)local_48,"geomID does not return correct type",&local_49);
  *puVar1 = &PTR__rtcore_error_021d38e0;
  *(undefined4 *)(puVar1 + 1) = 2;
  std::__cxx11::string::string((string *)(puVar1 + 2),(string *)local_48);
  __cxa_throw(puVar1,&rtcore_error::typeinfo,rtcore_error::~rtcore_error);
}

Assistant:

void createMeshAccel (size_t geomID, Builder*& builder)
      {
        bvh->objects[geomID] = new BVH(Primitive::type,scene);
        BVH* accel = bvh->objects[geomID];
        auto mesh = scene->getSafe<Mesh>(geomID);
        if (nullptr == mesh) {
          throw_RTCError(RTC_ERROR_INVALID_ARGUMENT,"geomID does not return correct type");
          return;
        }

        __internal_two_level_builder__::MeshBuilder<N,Mesh,Primitive>()(accel, mesh, geomID, this->gtype, this->useMortonBuilder_, builder);
      }